

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

string * __thiscall cmake::ReportCapabilities_abi_cxx11_(string *__return_storage_ptr__,cmake *this)

{
  size_t in_RCX;
  FastWriter writer;
  undefined1 local_90 [72];
  FastWriter local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  Json::FastWriter::FastWriter(&local_48);
  ReportCapabilitiesJson((Value *)(local_90 + 0x20),this);
  Json::FastWriter::write_abi_cxx11_((FastWriter *)local_90,(int)&local_48,local_90 + 0x20,in_RCX);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_90);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  Json::Value::~Value((Value *)(local_90 + 0x20));
  Json::FastWriter::~FastWriter(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::ReportCapabilities() const
{
  std::string result;
#if defined(CMAKE_BUILD_WITH_CMAKE)
  Json::FastWriter writer;
  result = writer.write(this->ReportCapabilitiesJson());
#else
  result = "Not supported";
#endif
  return result;
}